

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O1

string * __thiscall
MinVR::VRDataIndex::addData<int>
          (string *__return_storage_ptr__,VRDataIndex *this,string *key,string *nameSpace,int value)

{
  long *plVar1;
  size_type *psVar2;
  string local_68;
  string local_48;
  
  if (*(key->_M_dataplus)._M_p == '/') {
    addData(__return_storage_ptr__,this,key,value);
  }
  else {
    validateNameSpace(&local_48,this,nameSpace);
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_48,(ulong)(key->_M_dataplus)._M_p);
    psVar2 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar2) {
      local_68.field_2._M_allocated_capacity = *psVar2;
      local_68.field_2._8_8_ = plVar1[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar2;
      local_68._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_68._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    addData(__return_storage_ptr__,this,&local_68,value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string addData(const std::string &key,
                      const std::string nameSpace, T value) {

    // If the name provided is an absolute name, ignore the nameSpace.
    if (key[0] == '/') {

      return addData(key, value);
    } else {

      return addData(validateNameSpace(nameSpace) + key, value);
    }
  }